

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void adjust_assign(LexState *ls,int nvars,int nexps,expdesc *e)

{
  int *piVar1;
  int n;
  int iVar2;
  
  n = nvars - nexps;
  if (e->k - VCALL < 2) {
    iVar2 = -1;
    if (-1 < n) {
      iVar2 = n;
    }
    luaK_setreturns((FuncState *)ls,e,iVar2 + 1);
    if (0 < n) {
      luaK_checkstack((FuncState *)ls,iVar2);
      piVar1 = (int *)((long)&ls->L + 4);
      *piVar1 = *piVar1 + iVar2;
    }
  }
  else {
    if (e->k != VVOID) {
      luaK_exp2nextreg((FuncState *)ls,e);
    }
    if (0 < n) {
      iVar2 = *(int *)((long)&ls->L + 4);
      luaK_checkstack((FuncState *)ls,n);
      piVar1 = (int *)((long)&ls->L + 4);
      *piVar1 = *piVar1 + n;
      luaK_nil((FuncState *)ls,iVar2,n);
      return;
    }
  }
  return;
}

Assistant:

static void adjust_assign(LexState*ls,int nvars,int nexps,expdesc*e){
FuncState*fs=ls->fs;
int extra=nvars-nexps;
if(hasmultret(e->k)){
extra++;
if(extra<0)extra=0;
luaK_setreturns(fs,e,extra);
if(extra>1)luaK_reserveregs(fs,extra-1);
}
else{
if(e->k!=VVOID)luaK_exp2nextreg(fs,e);
if(extra>0){
int reg=fs->freereg;
luaK_reserveregs(fs,extra);
luaK_nil(fs,reg,extra);
}
}
}